

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

var __thiscall cs::function::call_rl(function *this,function *_this,vector *args)

{
  pointer paVar1;
  element_type *it;
  runtime_error *this_00;
  size_t i;
  ulong uVar2;
  long lVar3;
  long lVar4;
  scope_guard scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [4];
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  process_context::poll_event((process_context *)current_process);
  if ((long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 ==
      (long)(_this->mArgs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(_this->mArgs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    scope_guard::scope_guard(&scope,&_this->mContext);
    lVar3 = 0;
    lVar4 = 0;
    uVar2 = 0;
    while( true ) {
      paVar1 = (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Vector_impl_data._M_start;
      it = (((_this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      if ((ulong)((long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >> 3) <= uVar2)
      break;
      domain_manager::add_var_no_return<std::__cxx11::string_const&>
                (&(it->super_runtime_type).storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(((_this->mArgs).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3),
                 (var *)((long)&paVar1->mDat + lVar4));
      uVar2 = uVar2 + 1;
      lVar4 = lVar4 + 8;
      lVar3 = lVar3 + 0x20;
    }
    local_110[0]._M_dataplus._M_p =
         (pointer)(*(_this->mBody).
                    super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur)[1]._vptr_statement_base;
    runtime_type::parse_expr((runtime_type *)this,(iterator *)it,SUB81(local_110,0));
    scope_guard::~scope_guard(&scope);
    return (var)(proxy *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string
            (&local_70,
             (long)(_this->mArgs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(_this->mArgs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  std::operator+(&local_50,"Wrong size of arguments. Expected ",&local_70);
  std::operator+(local_110,&local_50,", provided ");
  std::__cxx11::to_string
            (&local_90,
             (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scope,
                 local_110,&local_90);
  runtime_error::runtime_error(this_00,(string *)&scope);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var function::call_rl(const function *_this, vector &args)
	{
		current_process->poll_event();
		if (args.size() != _this->mArgs.size())
			throw runtime_error(
			    "Wrong size of arguments. Expected " + std::to_string(_this->mArgs.size()) + ", provided " +
			    std::to_string(args.size()));
		scope_guard scope(_this->mContext);
#ifdef CS_DEBUGGER
		fcall_guard fcall(_this->mDecl);
		if(_this->mMatch)
			cs_debugger_func_callback(_this->mDecl, _this->mStmt);
#endif
		for (std::size_t i = 0; i < args.size(); ++i)
			_this->mContext->instance->storage.add_var_no_return(_this->mArgs[i], args[i]);
		try {
			return _this->mContext->instance->parse_expr(static_cast<const statement_return *>(_this->mBody.front())->get_tree().root());
		}
		catch (const cs::exception &e) {
			throw e;
		}
		catch (const std::exception &e) {
			const statement_base *ptr = _this->mBody.front();
			throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
		}
	}